

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

base_learner * memory_tree_setup(options_i *options,vw *all)

{
  size_t *location;
  int *location_00;
  vw_ostream *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  parser *ppVar6;
  double dVar7;
  memory_tree *b;
  typed_option<unsigned_long> *ptVar8;
  option_group_definition *poVar9;
  typed_option<float> *op;
  typed_option<unsigned_int> *op_00;
  typed_option<int> *ptVar10;
  ulong uVar11;
  ostream *poVar12;
  base_learner *pbVar13;
  single_learner *psVar14;
  learner<memory_tree_ns::memory_tree,_example> *plVar15;
  long lVar16;
  undefined **ppuVar17;
  label_parser *plVar18;
  byte bVar19;
  undefined1 auVar20 [16];
  size_type __dnew_10;
  option_group_definition new_options;
  size_type __dnew_3;
  size_type __dnew_1;
  size_type __dnew_9;
  size_type __dnew_8;
  size_type __dnew_7;
  size_type __dnew_6;
  size_type __dnew_5;
  size_type __dnew;
  long local_968;
  _func_int ***local_960;
  _func_int **local_958;
  _func_int **local_950 [2];
  _func_int ***local_940;
  _func_int **local_938;
  _func_int **local_930 [2];
  _func_int ***local_920;
  _func_int **local_918;
  _func_int **local_910 [2];
  _func_int ***local_900;
  _func_int **local_8f8;
  _func_int **local_8f0 [2];
  _func_int ***local_8e0;
  _func_int **local_8d8;
  _func_int **local_8d0 [2];
  _func_int ***local_8c0;
  _func_int **local_8b8;
  _func_int **local_8b0 [2];
  string local_8a0;
  _func_int ***local_880;
  _func_int **local_878;
  _func_int **local_870 [2];
  string local_860;
  _func_int ***local_840;
  _func_int **local_838;
  _func_int **local_830 [2];
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  undefined4 *local_780;
  undefined8 local_778;
  undefined4 local_770;
  undefined2 local_76c;
  string local_760;
  string local_740;
  option_group_definition local_720;
  long *local_6e8;
  long local_6e0;
  long local_6d8 [2];
  double local_6c8;
  double dStack_6c0;
  string local_6b0;
  undefined7 *local_690;
  undefined8 local_688;
  undefined7 local_680;
  undefined4 uStack_679;
  undefined1 local_675;
  typed_option<float> local_670;
  typed_option<unsigned_long> local_5d0;
  typed_option<int> local_530;
  typed_option<int> local_490;
  typed_option<int> local_3f0;
  typed_option<int> local_350;
  typed_option<int> local_2b0;
  typed_option<unsigned_long> local_210;
  typed_option<unsigned_int> local_170;
  typed_option<unsigned_long> local_d0;
  
  bVar19 = 0;
  b = calloc_or_throw<memory_tree_ns::memory_tree>(1);
  (b->nodes)._begin = (node *)0x0;
  (b->nodes)._end = (node *)0x0;
  (b->nodes).end_array = (node *)0x0;
  (b->nodes).erase_count = 0;
  (b->examples)._begin = (example **)0x0;
  (b->examples)._end = (example **)0x0;
  (b->examples).end_array = (example **)0x0;
  (b->examples).erase_count = 0;
  b->alpha = 0.5;
  b->routers_used = 0;
  b->iter = 0;
  b->test_mode = false;
  b->max_depth = 0;
  b->max_ex_in_leaf = 0;
  *(undefined8 *)((long)&b->max_ex_in_leaf + 4) = 0;
  b->test_time = 0.0;
  b->num_mistakes = 0;
  b->top_K = 1;
  local_680 = 0x2079726f6d654d;
  uStack_679 = 0x65657254;
  local_688 = 0xb;
  local_675 = 0;
  local_720.m_name._M_dataplus._M_p = (pointer)&local_720.m_name.field_2;
  local_690 = &local_680;
  std::__cxx11::string::_M_construct<char*>((string *)&local_720,&local_680);
  local_720.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_720.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_720.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_690 != &local_680) {
    operator_delete(local_690);
  }
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  local_740.field_2._M_allocated_capacity._0_7_ = 0x5f79726f6d656d;
  local_740.field_2._7_4_ = 0x65657274;
  local_740._M_string_length = 0xb;
  local_740.field_2._M_local_buf[0xb] = '\0';
  location = &b->max_nodes;
  VW::config::typed_option<unsigned_long>::typed_option(&local_d0,&local_740,location);
  local_d0.super_base_option.m_keep = true;
  ptVar8 = VW::config::typed_option<unsigned_long>::default_value(&local_d0,0);
  local_840 = local_830;
  local_210.super_base_option._vptr_base_option = (_func_int **)0x29;
  local_840 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_840,(ulong)&local_210);
  local_830[0] = local_210.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_840 + 0x19),"t most <",8);
  builtin_strncpy((char *)((long)local_840 + 0x21),"n> nodes",8);
  local_840[2] = (_func_int **)0x2068746977206565;
  local_840[3] = (_func_int **)0x2074736f6d207461;
  *local_840 = (_func_int **)0x6d206120656b614d;
  local_840[1] = (_func_int **)0x72742079726f6d65;
  local_838 = local_210.super_base_option._vptr_base_option;
  *(char *)((long)local_840 + (long)local_210.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (&local_720,ptVar8);
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  local_5d0.super_base_option._vptr_base_option = (_func_int **)0x14;
  local_860._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_860,(ulong)&local_5d0);
  local_860.field_2._M_allocated_capacity = (size_type)local_5d0.super_base_option._vptr_base_option
  ;
  builtin_strncpy(local_860._M_dataplus._M_p,"max_number_of_labels",0x14);
  local_860._M_string_length = (size_type)local_5d0.super_base_option._vptr_base_option;
  local_860._M_dataplus._M_p[(long)local_5d0.super_base_option._vptr_base_option] = '\0';
  VW::config::typed_option<unsigned_long>::typed_option(&local_210,&local_860,&b->max_num_labels);
  ptVar8 = VW::config::typed_option<unsigned_long>::default_value(&local_210,10);
  local_880 = local_870;
  local_5d0.super_base_option._vptr_base_option = (_func_int **)0x1a;
  local_880 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_880,(ulong)&local_5d0);
  local_870[0] = local_5d0.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_880 + 10)," of uniq",8);
  builtin_strncpy((char *)((long)local_880 + 0x12),"ue label",8);
  *local_880 = (_func_int **)0x626d756e2078616d;
  local_880[1] = (_func_int **)0x6e7520666f207265;
  local_878 = local_5d0.super_base_option._vptr_base_option;
  *(char *)((long)local_880 + (long)local_5d0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar9,ptVar8);
  local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
  local_670.super_base_option._vptr_base_option = (_func_int **)0x17;
  local_8a0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_8a0,(ulong)&local_670);
  local_8a0.field_2._M_allocated_capacity = (size_type)local_670.super_base_option._vptr_base_option
  ;
  builtin_strncpy(local_8a0._M_dataplus._M_p,"leaf_example_multiplier",0x17);
  local_8a0._M_string_length = (size_type)local_670.super_base_option._vptr_base_option;
  local_8a0._M_dataplus._M_p[(long)local_670.super_base_option._vptr_base_option] = '\0';
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_5d0,&local_8a0,&b->leaf_example_multiplier);
  ptVar8 = VW::config::typed_option<unsigned_long>::default_value(&local_5d0,1);
  local_8c0 = local_8b0;
  local_670.super_base_option._vptr_base_option = (_func_int **)0x35;
  local_8c0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_8c0,(ulong)&local_670);
  local_8b0[0] = local_670.super_base_option._vptr_base_option;
  local_8c0[4] = (_func_int **)0x746c756166656428;
  local_8c0[5] = (_func_int **)0x6e20676f6c203d20;
  local_8c0[2] = (_func_int **)0x702073656c706d61;
  local_8c0[3] = (_func_int **)0x206661656c207265;
  *local_8c0 = (_func_int **)0x696c7069746c756d;
  local_8c0[1] = (_func_int **)0x7865206e6f207265;
  builtin_strncpy((char *)((long)local_8c0 + 0x2d),"g nodes)",8);
  local_8b8 = local_670.super_base_option._vptr_base_option;
  *(char *)((long)local_8c0 + (long)local_670.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar9,ptVar8);
  local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
  local_760.field_2._M_allocated_capacity._0_4_ = 0x68706c61;
  local_760.field_2._M_allocated_capacity._4_2_ = 0x61;
  local_760._M_string_length = 5;
  VW::config::typed_option<float>::typed_option(&local_670,&local_760,&b->alpha);
  op = VW::config::typed_option<float>::default_value(&local_670,0.1);
  local_780 = &local_770;
  local_770 = 0x68706c41;
  local_76c = 0x61;
  local_778 = 5;
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar9,op);
  local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
  local_7a0.field_2._M_allocated_capacity._0_5_ = 0x6d61657264;
  local_7a0.field_2._M_allocated_capacity._5_3_ = 0x65725f;
  local_7a0.field_2._8_5_ = 0x7374616570;
  local_7a0._M_string_length = 0xd;
  local_7a0.field_2._M_local_buf[0xd] = '\0';
  VW::config::typed_option<unsigned_int>::typed_option(&local_170,&local_7a0,&b->dream_repeats);
  op_00 = VW::config::typed_option<unsigned_int>::default_value(&local_170,1);
  local_8e0 = local_8d0;
  local_2b0.super_base_option._vptr_base_option = (_func_int **)0x34;
  local_8e0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_8e0,(ulong)&local_2b0);
  local_8d0[0] = local_2b0.super_base_option._vptr_base_option;
  local_8e0[4] = (_func_int **)0x2820656c706d6178;
  local_8e0[5] = (_func_int **)0x20746c7561666564;
  local_8e0[2] = (_func_int **)0x6f6974617265706f;
  local_8e0[3] = (_func_int **)0x652072657020736e;
  *local_8e0 = (_func_int **)0x6f207265626d756e;
  local_8e0[1] = (_func_int **)0x206d616572642066;
  *(undefined4 *)(local_8e0 + 6) = 0x2931203d;
  local_8d8 = local_2b0.super_base_option._vptr_base_option;
  *(char *)((long)local_8e0 + (long)local_2b0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(op_00->super_base_option).m_help);
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (poVar9,op_00);
  local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
  local_7c0.field_2._M_allocated_capacity._0_4_ = 0x5f706f74;
  local_7c0.field_2._M_allocated_capacity._4_2_ = 0x4b;
  local_7c0._M_string_length = 5;
  VW::config::typed_option<int>::typed_option(&local_2b0,&local_7c0,&b->top_K);
  ptVar10 = VW::config::typed_option<int>::default_value(&local_2b0,1);
  local_900 = local_8f0;
  local_350.super_base_option._vptr_base_option = (_func_int **)0x22;
  local_900 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_900,(ulong)&local_350);
  local_8f0[0] = local_350.super_base_option._vptr_base_option;
  local_900[2] = (_func_int **)0x2820726f72726520;
  local_900[3] = (_func_int **)0x20746c7561666564;
  *local_900 = (_func_int **)0x7270204b20706f74;
  local_900[1] = (_func_int **)0x6e6f697463696465;
  *(undefined2 *)(local_900 + 4) = 0x2931;
  local_8f8 = local_350.super_base_option._vptr_base_option;
  *(char *)((long)local_900 + (long)local_350.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar9,ptVar10);
  local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
  local_7e0.field_2._M_allocated_capacity._0_5_ = 0x6e7261656c;
  local_7e0.field_2._M_allocated_capacity._5_3_ = 0x74615f;
  local_7e0.field_2._8_5_ = 0x6661656c5f;
  local_7e0._M_string_length = 0xd;
  local_7e0.field_2._M_local_buf[0xd] = '\0';
  VW::config::typed_option<int>::typed_option(&local_350,&local_7e0,&b->learn_at_leaf);
  ptVar10 = VW::config::typed_option<int>::default_value(&local_350,0);
  local_920 = local_910;
  local_3f0.super_base_option._vptr_base_option = (_func_int **)0x2d;
  local_920 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_920,(ulong)&local_3f0);
  local_910[0] = local_3f0.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_920 + 0x1d),"(defualt",8);
  builtin_strncpy((char *)((long)local_920 + 0x25)," = True)",8);
  local_920[2] = (_func_int **)0x207461206e726165;
  local_920[3] = (_func_int **)0x656428206661656c;
  *local_920 = (_func_int **)0x2072656874656877;
  local_920[1] = (_func_int **)0x6c20746f6e20726f;
  local_918 = local_3f0.super_base_option._vptr_base_option;
  *(char *)((long)local_920 + (long)local_3f0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar9,ptVar10);
  local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
  local_800.field_2._M_allocated_capacity._0_4_ = 0x73616f;
  local_800._M_string_length = 3;
  location_00 = &b->oas;
  VW::config::typed_option<int>::typed_option(&local_3f0,&local_800,location_00);
  ptVar10 = VW::config::typed_option<int>::default_value(&local_3f0,0);
  local_940 = local_930;
  local_490.super_base_option._vptr_base_option = (_func_int **)0x13;
  local_940 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_940,(ulong)&local_490);
  local_930[0] = local_490.super_base_option._vptr_base_option;
  *local_940 = (_func_int **)0x2073616f20657375;
  local_940[1] = (_func_int **)0x6c20656874207461;
  builtin_strncpy((char *)((long)local_940 + 0xf),"leaf",4);
  local_938 = local_490.super_base_option._vptr_base_option;
  *(char *)((long)local_940 + (long)local_490.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar9,ptVar10);
  local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
  local_820.field_2._M_allocated_capacity._0_7_ = 0x615f6d61657264;
  local_820.field_2._M_local_buf[7] = 't';
  local_820.field_2._8_7_ = 0x6574616470755f;
  local_820._M_string_length = 0xf;
  local_820.field_2._M_local_buf[0xf] = '\0';
  VW::config::typed_option<int>::typed_option(&local_490,&local_820,&b->dream_at_update);
  ptVar10 = VW::config::typed_option<int>::default_value(&local_490,0);
  local_960 = local_950;
  local_530.super_base_option._vptr_base_option = (_func_int **)0x37;
  local_960 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_960,(ulong)&local_530);
  local_950[0] = local_530.super_base_option._vptr_base_option;
  local_960[4] = (_func_int **)0x6465736162206472;
  local_960[5] = (_func_int **)0x2065746164707520;
  local_960[2] = (_func_int **)0x736e6f6974617265;
  local_960[3] = (_func_int **)0x6177657220746120;
  *local_960 = (_func_int **)0x206e6f206e727574;
  local_960[1] = (_func_int **)0x706f206d61657264;
  builtin_strncpy((char *)((long)local_960 + 0x2f)," as well",8);
  local_958 = local_530.super_base_option._vptr_base_option;
  *(char *)((long)local_960 + (long)local_530.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar9,ptVar10);
  local_6b0.field_2._M_allocated_capacity._0_4_ = 0x696c6e6f;
  local_6b0.field_2._M_allocated_capacity._4_2_ = 0x656e;
  local_6b0._M_string_length = 6;
  local_6b0.field_2._M_local_buf[6] = '\0';
  local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
  VW::config::typed_option<int>::typed_option(&local_530,&local_6b0,&b->online);
  ptVar10 = VW::config::typed_option<int>::default_value(&local_530,0);
  local_968 = 0x37;
  local_6e8 = local_6d8;
  local_6e8 = (long *)std::__cxx11::string::_M_create((ulong *)&local_6e8,(ulong)&local_968);
  local_6d8[0] = local_968;
  local_6e8[4] = 0x6465736162206472;
  local_6e8[5] = 0x2065746164707520;
  local_6e8[2] = 0x736e6f6974617265;
  local_6e8[3] = 0x6177657220746120;
  *local_6e8 = 0x206e6f206e727574;
  local_6e8[1] = 0x706f206d61657264;
  builtin_strncpy((char *)((long)local_6e8 + 0x2f)," as well",8);
  local_6e0 = local_968;
  *(char *)((long)local_6e8 + local_968) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar9,ptVar10);
  if (local_6e8 != local_6d8) {
    operator_delete(local_6e8);
  }
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d71d0;
  if (local_530.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
    operator_delete(local_6b0._M_dataplus._M_p);
  }
  if (local_960 != local_950) {
    operator_delete(local_960);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d71d0;
  if (local_490.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_490.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p);
  }
  if (local_940 != local_930) {
    operator_delete(local_940);
  }
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d71d0;
  if (local_3f0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_800._M_dataplus._M_p != &local_800.field_2) {
    operator_delete(local_800._M_dataplus._M_p);
  }
  if (local_920 != local_910) {
    operator_delete(local_920);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d71d0;
  if (local_350.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
    operator_delete(local_7e0._M_dataplus._M_p);
  }
  if (local_900 != local_8f0) {
    operator_delete(local_900);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d71d0;
  if (local_2b0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
    operator_delete(local_7c0._M_dataplus._M_p);
  }
  if (local_8e0 != local_8d0) {
    operator_delete(local_8e0);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d7160;
  if (local_170.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
    operator_delete(local_7a0._M_dataplus._M_p);
  }
  if (local_780 != &local_770) {
    operator_delete(local_780);
  }
  local_670.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d7128;
  if (local_670.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_670.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_670.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760._M_dataplus._M_p != &local_760.field_2) {
    operator_delete(local_760._M_dataplus._M_p);
  }
  if (local_8c0 != local_8b0) {
    operator_delete(local_8c0);
  }
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d70f0;
  if (local_5d0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_5d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
    operator_delete(local_8a0._M_dataplus._M_p);
  }
  if (local_880 != local_870) {
    operator_delete(local_880);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d70f0;
  if (local_210.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_dataplus._M_p != &local_860.field_2) {
    operator_delete(local_860._M_dataplus._M_p);
  }
  if (local_840 != local_830) {
    operator_delete(local_840);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d70f0;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_720);
  sVar2 = *location;
  if (sVar2 == 0) {
    plVar15 = (learner<memory_tree_ns::memory_tree,_example> *)0x0;
  }
  else {
    b->all = all;
    b->current_pass = 0;
    b->final_pass = all->numpasses;
    dStack_6c0 = (double)CONCAT44(0x45300000,(int)(b->leaf_example_multiplier >> 0x20)) -
                 1.9342813113834067e+25;
    local_6c8 = dStack_6c0 +
                ((double)CONCAT44(0x43300000,(int)b->leaf_example_multiplier) - 4503599627370496.0);
    auVar20._8_4_ = (int)(sVar2 >> 0x20);
    auVar20._0_8_ = sVar2;
    auVar20._12_4_ = 0x45300000;
    dVar7 = log((auVar20._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
    dVar7 = (dVar7 / 0.6931471805599453) * local_6c8;
    uVar11 = (ulong)dVar7;
    b->max_leaf_examples = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
    memory_tree_ns::init_tree(b);
    if (all->quiet == false) {
      pvVar1 = &all->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>(&pvVar1->super_ostream,"memory_tree:",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(&pvVar1->super_ostream," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(&pvVar1->super_ostream,"max_nodes = ",0xc);
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)pvVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"max_leaf_examples = ",0x14);
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"alpha = ",8);
      poVar12 = std::ostream::_M_insert<double>((double)b->alpha);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"oas = ",6);
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,*location_00);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"online =",8);
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,b->online);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
    }
    sVar2 = *location;
    if (*location_00 == 0) {
      pbVar13 = setup_base(options,all);
      psVar14 = LEARNER::as_singleline<char,char>(pbVar13);
      ppVar6 = all->p;
      plVar15 = LEARNER::learner<memory_tree_ns::memory_tree,example>::
                init_learner<LEARNER::learner<char,example>>
                          (b,psVar14,memory_tree_ns::learn,memory_tree_ns::predict,sVar2 + 1,
                           multiclass);
      *(undefined8 *)(plVar15 + 0x58) = *(undefined8 *)(plVar15 + 0x18);
      *(code **)(plVar15 + 0x68) = MULTICLASS::finish_example<memory_tree_ns::memory_tree>;
      ppuVar17 = &MULTICLASS::mc_label;
      plVar18 = &ppVar6->lp;
      for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
        plVar18->default_label = (_func_void_void_ptr *)*ppuVar17;
        ppuVar17 = ppuVar17 + (ulong)bVar19 * -2 + 1;
        plVar18 = (label_parser *)((long)plVar18 + (ulong)bVar19 * -0x10 + 8);
      }
      *(code **)(plVar15 + 0x80) = memory_tree_ns::save_load_memory_tree;
      uVar4 = *(undefined8 *)(plVar15 + 0x18);
      uVar5 = *(undefined8 *)(plVar15 + 0x20);
      *(undefined8 *)(plVar15 + 0x70) = uVar4;
      *(undefined8 *)(plVar15 + 0x78) = uVar5;
      *(undefined8 *)(plVar15 + 0x88) = uVar4;
      *(undefined8 *)(plVar15 + 0x90) = uVar5;
      *(code **)(plVar15 + 0x98) = memory_tree_ns::end_pass;
      *(undefined8 *)(plVar15 + 0xb8) = uVar4;
      *(undefined8 *)(plVar15 + 0xc0) = uVar5;
      *(code **)(plVar15 + 200) = memory_tree_ns::finish;
    }
    else {
      sVar3 = b->max_num_labels;
      pbVar13 = setup_base(options,all);
      psVar14 = LEARNER::as_singleline<char,char>(pbVar13);
      plVar15 = LEARNER::learner<memory_tree_ns::memory_tree,example>::
                init_learner<LEARNER::learner<char,example>>
                          (b,psVar14,memory_tree_ns::learn,memory_tree_ns::predict,sVar2 + 1 + sVar3
                           ,multilabels);
      uVar4 = *(undefined8 *)(plVar15 + 0x18);
      uVar5 = *(undefined8 *)(plVar15 + 0x20);
      *(undefined8 *)(plVar15 + 0x88) = uVar4;
      *(undefined8 *)(plVar15 + 0x90) = uVar5;
      *(code **)(plVar15 + 0x98) = memory_tree_ns::end_pass;
      *(code **)(plVar15 + 0x80) = memory_tree_ns::save_load_memory_tree;
      *(undefined8 *)(plVar15 + 0x70) = uVar4;
      *(undefined8 *)(plVar15 + 0x78) = uVar5;
      *(undefined8 *)(plVar15 + 0xb8) = uVar4;
      *(undefined8 *)(plVar15 + 0xc0) = uVar5;
      *(code **)(plVar15 + 200) = memory_tree_ns::finish;
      ppuVar17 = &MULTILABEL::multilabel;
      plVar18 = &all->p->lp;
      for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
        plVar18->default_label = (_func_void_void_ptr *)*ppuVar17;
        ppuVar17 = ppuVar17 + (ulong)bVar19 * -2 + 1;
        plVar18 = (label_parser *)((long)plVar18 + (ulong)bVar19 * -0x10 + 8);
      }
      all->label_type = multi;
      all->delete_prediction = (_func_void_void_ptr *)PTR_delete_label_002dbac0;
    }
    b = (memory_tree *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_720.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_720.m_name._M_dataplus._M_p != &local_720.m_name.field_2) {
    operator_delete(local_720.m_name._M_dataplus._M_p);
  }
  if (b != (memory_tree *)0x0) {
    free(b);
  }
  return (base_learner *)plVar15;
}

Assistant:

base_learner* memory_tree_setup(options_i& options, vw& all)
{
    using namespace memory_tree_ns;
	auto tree = scoped_calloc_or_throw<memory_tree>();
    option_group_definition new_options("Memory Tree");

    new_options.add(make_option("memory_tree", tree->max_nodes).keep().default_value(0).help("Make a memory tree with at most <n> nodes"))
        .add(make_option("max_number_of_labels",tree->max_num_labels).default_value(10).help("max number of unique label"))
        .add(make_option("leaf_example_multiplier",tree->leaf_example_multiplier).default_value(1).help("multiplier on examples per leaf (default = log nodes)"))
        .add(make_option("alpha", tree->alpha).default_value(0.1f).help("Alpha"))
        .add(make_option("dream_repeats", tree->dream_repeats).default_value(1).help("number of dream operations per example (default = 1)"))
        .add(make_option("top_K",tree->top_K).default_value(1).help("top K prediction error (default 1)"))
        .add(make_option("learn_at_leaf",tree->learn_at_leaf).default_value(0).help("whether or not learn at leaf (defualt = True)"))
        .add(make_option("oas", tree->oas).default_value(0).help("use oas at the leaf"))
        .add(make_option("dream_at_update", tree->dream_at_update).default_value(0).help("turn on dream operations at reward based update as well"))
        .add(make_option("online", tree->online).default_value(0).help("turn on dream operations at reward based update as well"));
    options.add_and_parse(new_options);
if (!tree->max_nodes)
{
  return nullptr;
}

    tree->all = &all;
    tree->current_pass = 0;
    tree->final_pass = all.numpasses;

    tree->max_leaf_examples = tree->leaf_example_multiplier*(log(tree->max_nodes)/log(2));

    
    init_tree(*tree);

    if (!all.quiet)
        all.trace_message << "memory_tree:" << " "
            <<"max_nodes = "<< tree->max_nodes << " " 
            <<"max_leaf_examples = "<<tree->max_leaf_examples<<" "
 		    <<"alpha = "<<tree->alpha<<" "
            <<"oas = "<<tree->oas<<" "
            <<"online ="<<tree->online<<" "
            <<std::endl;
    
    size_t num_learners = 0;
    
    //multi-class classification
    if (tree->oas == false){
        num_learners = tree->max_nodes + 1;
        learner<memory_tree, example>& l = init_multiclass_learner (tree, 
                as_singleline(setup_base (options,all)),
                learn,
                predict,
                all.p, num_learners);
         //srand(time(0));
        l.set_save_load(save_load_memory_tree);
        l.set_end_pass(end_pass);
        l.set_finish(finish);

        return make_base (l);
    } //multi-label classification
    else{
        num_learners = tree->max_nodes + 1 + tree->max_num_labels;
        learner<memory_tree,example>& l = 
        init_learner(tree, 
                as_singleline(setup_base(options,all)), 
                learn, 
                predict, 
                num_learners,
                prediction_type::multilabels);

	//all.p->lp = MULTILABEL::multilabel;
        //all.label_type = label_type::multi;
        //all.delete_prediction = MULTILABEL::multilabel.delete_label;
         //srand(time(0));
	l.set_end_pass(end_pass);
        l.set_save_load(save_load_memory_tree);
        //l.set_end_pass(end_pass);
        l.set_finish(finish);

	all.p->lp = MULTILABEL::multilabel;
	all.label_type = label_type::multi;
	all.delete_prediction = MULTILABEL::multilabel.delete_label;

        return make_base (l);
    }

}